

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O3

int bin_mdef_ciphone_id_nocase(bin_mdef_t *m,char *ciphone)

{
  int iVar1;
  int32 iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar3 = m->n_ciphone;
  iVar4 = 0;
  do {
    if ((int)uVar3 <= iVar4) {
      return -1;
    }
    uVar5 = uVar3 + iVar4 >> 1;
    iVar2 = strcmp_nocase(ciphone,m->ciname[uVar5]);
    iVar1 = uVar5 + 1;
    if (iVar2 < 1) {
      uVar3 = uVar5;
      iVar1 = iVar4;
    }
    iVar4 = iVar1;
  } while (iVar2 != 0);
  return uVar5;
}

Assistant:

int
bin_mdef_ciphone_id_nocase(bin_mdef_t * m, const char *ciphone)
{
    int low, mid, high;

    /* Exact binary search on m->ciphone */
    low = 0;
    high = m->n_ciphone;
    while (low < high) {
        int c;

        mid = (low + high) / 2;
        c = strcmp_nocase(ciphone, m->ciname[mid]);
        if (c == 0)
            return mid;
        else if (c > 0)
            low = mid + 1;
        else
            high = mid;
    }
    return -1;
}